

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::ResolveTemplateFilename
          (TemplateCache *this,string *unresolved,string *resolved,FileStat *statbuf)

{
  bool bVar1;
  reference a;
  ostream *poVar2;
  ctemplate local_78 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator path;
  ReaderMutexLock local_38;
  ReaderMutexLock ml;
  FileStat *statbuf_local;
  string *resolved_local;
  string *unresolved_local;
  TemplateCache *this_local;
  
  ml.mu_ = (Mutex *)statbuf;
  ReaderMutexLock::ReaderMutexLock(&local_38,this->search_path_mutex_);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->search_path_);
  if ((bVar1) || (bVar1 = IsAbspath(unresolved), bVar1)) {
    std::__cxx11::string::operator=((string *)resolved,(string *)unresolved);
    bVar1 = File::Stat(resolved,(FileStat *)ml.mu_);
    if (bVar1) {
      if (0 < kVerbosity) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"V1: ");
        poVar2 = std::operator<<(poVar2,"Resolved ");
        poVar2 = std::operator<<(poVar2,(string *)unresolved);
        poVar2 = std::operator<<(poVar2," to ");
        poVar2 = std::operator<<(poVar2,(string *)resolved);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      this_local._7_1_ = true;
      goto LAB_0015ec25;
    }
  }
  else {
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->search_path_);
    while( true ) {
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->search_path_);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      a = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_50);
      PathJoin(local_78,a,unresolved);
      std::__cxx11::string::operator=((string *)resolved,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      bVar1 = File::Stat(resolved,(FileStat *)ml.mu_);
      if (bVar1) {
        if (0 < kVerbosity) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"V1: ");
          poVar2 = std::operator<<(poVar2,"Resolved ");
          poVar2 = std::operator<<(poVar2,(string *)unresolved);
          poVar2 = std::operator<<(poVar2," to ");
          poVar2 = std::operator<<(poVar2,(string *)resolved);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        this_local._7_1_ = true;
        goto LAB_0015ec25;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  std::__cxx11::string::clear();
  this_local._7_1_ = false;
LAB_0015ec25:
  path._M_current._0_4_ = 1;
  ReaderMutexLock::~ReaderMutexLock(&local_38);
  return this_local._7_1_;
}

Assistant:

bool TemplateCache::ResolveTemplateFilename(const string& unresolved,
                                            string* resolved,
                                            FileStat* statbuf) const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty() || IsAbspath(unresolved)) {
    *resolved = unresolved;
    if (File::Stat(*resolved, statbuf)) {
      VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
      return true;
    }
  } else {
    for (TemplateSearchPath::const_iterator path = search_path_.begin();
         path != search_path_.end();
         ++path) {
      *resolved = PathJoin(*path, unresolved);
      if (File::Stat(*resolved, statbuf)) {
        VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
        return true;
      }
    }
  }

  resolved->clear();
  return false;
}